

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::Clear
          (ItemSimilarityRecommender_ConnectedItem *this)

{
  uint32_t cached_has_bits;
  ItemSimilarityRecommender_ConnectedItem *this_local;
  
  memset(&this->itemid_,0,0x10);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ItemSimilarityRecommender_ConnectedItem::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&itemid_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&similarityscore_) -
      reinterpret_cast<char*>(&itemid_)) + sizeof(similarityscore_));
  _internal_metadata_.Clear<std::string>();
}